

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::TreeEnsembleParameters::InternalSwap
          (TreeEnsembleParameters *this,TreeEnsembleParameters *other)

{
  int iVar1;
  uint64 uVar2;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->nodes_).super_RepeatedPtrFieldBase,&(other->nodes_).super_RepeatedPtrFieldBase)
  ;
  google::protobuf::RepeatedField<double>::InternalSwap
            (&this->basepredictionvalue_,&other->basepredictionvalue_);
  uVar2 = this->numpredictiondimensions_;
  this->numpredictiondimensions_ = other->numpredictiondimensions_;
  other->numpredictiondimensions_ = uVar2;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void TreeEnsembleParameters::InternalSwap(TreeEnsembleParameters* other) {
  nodes_.InternalSwap(&other->nodes_);
  basepredictionvalue_.InternalSwap(&other->basepredictionvalue_);
  std::swap(numpredictiondimensions_, other->numpredictiondimensions_);
  std::swap(_cached_size_, other->_cached_size_);
}